

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

bool __thiscall
libcellml::ComponentEntity::replaceComponent
          (ComponentEntity *this,ComponentPtr *oldComponent,ComponentPtr *newComponent,
          bool searchEncapsulated)

{
  EntityImpl *pEVar1;
  bool bVar2;
  const_iterator cVar3;
  size_t i;
  ulong uVar4;
  ComponentEntity local_40;
  
  cVar3 = ComponentEntityImpl::findComponent
                    ((ComponentEntityImpl *)
                     (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,oldComponent
                    );
  bVar2 = replaceComponent(this,(long)((long)cVar3._M_current -
                                      (this->super_NamedEntity).super_ParentedEntity.super_Entity.
                                      mPimpl[2].mId.field_2._M_allocated_capacity) >> 4,newComponent
                          );
  if (searchEncapsulated && !bVar2) {
    bVar2 = false;
    for (uVar4 = 0;
        (bVar2 == false &&
        (pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
        uVar4 < (ulong)((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                              pEVar1[2].mId.field_2._M_allocated_capacity) >> 4)));
        uVar4 = uVar4 + 1) {
      component(&local_40,(size_t)this);
      bVar2 = replaceComponent((ComponentEntity *)
                               local_40.super_NamedEntity.super_ParentedEntity.super_Entity.
                               _vptr_Entity,oldComponent,newComponent,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
  }
  return bVar2;
}

Assistant:

bool ComponentEntity::replaceComponent(const ComponentPtr &oldComponent, const ComponentPtr &newComponent, bool searchEncapsulated)
{
    bool status = replaceComponent(size_t(pFunc()->findComponent(oldComponent) - pFunc()->mComponents.begin()), newComponent);

    if (searchEncapsulated && !status) {
        for (size_t i = 0; i < componentCount() && !status; ++i) {
            status = component(i)->replaceComponent(oldComponent, newComponent, searchEncapsulated);
        }
    }

    return status;
}